

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

void __thiscall
branch_and_reduce_algorithm::get_articulation_points(branch_and_reduce_algorithm *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar1;
  size_type __new_size;
  ulong uVar2;
  value_type_conflict1 local_3c [3];
  
  this->current_dfs_num = 0;
  uVar1 = (int)((long)(this->adj).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->adj).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  this_00 = &this->visited;
  std::vector<int,_std::allocator<int>_>::resize(this_00,0);
  std::vector<int,_std::allocator<int>_>::resize(&this->minNr,0);
  std::vector<int,_std::allocator<int>_>::resize(&this->articulation_points,0);
  __new_size = (size_type)(int)uVar1;
  local_3c[2] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size,local_3c + 2);
  local_3c[1] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize(&this->minNr,__new_size,local_3c + 1);
  local_3c[0] = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->articulation_points,__new_size,local_3c);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar2] < 0) &&
         ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar2] < 0)) {
        dfs_root(this,(int)uVar2);
      }
      uVar2 = uVar2 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar2);
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::get_articulation_points()
{
    current_dfs_num = 0;
    const int n = adj.size();

    visited.resize(0);
    minNr.resize(0);
    articulation_points.resize(0);

    visited.resize(n, -1);
    minNr.resize(n, -1);
    articulation_points.resize(n, 0);

    // Start DFS
    for (int i = 0; i < n; i++)
        if (x[i] < 0 && visited[i] < 0) // node active but not yet visited
            dfs_root(i);
}